

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

int sha3_shake_done(hash_state *md,uchar *out,unsigned_long outlen)

{
  ulong uVar1;
  long lVar2;
  ulong in_RDX;
  long in_RSI;
  ulong *in_RDI;
  ulong64 *unaff_retaddr;
  ulong64 __t_1;
  ulong64 __t;
  uint i;
  unsigned_long idx;
  uint local_2c;
  ulong local_28;
  
  if (in_RDX != 0) {
    if (in_RDI == (ulong *)0x0) {
      fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",
              0x103);
    }
    if (in_RSI == 0) {
      fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",
              0x104);
    }
    if (*(short *)((long)in_RDI + 0x19e) == 0) {
      in_RDI[(ulong)*(ushort *)((long)in_RDI + 0x19a) + 1] =
           *in_RDI ^ 0x1fL << (((byte)(short)in_RDI[0x33] & 7) << 3) ^
           in_RDI[(ulong)*(ushort *)((long)in_RDI + 0x19a) + 1];
      lVar2 = (long)(int)(0x18 - (uint)*(ushort *)((long)in_RDI + 0x19c));
      in_RDI[lVar2 + 1] = in_RDI[lVar2 + 1] ^ 0x8000000000000000;
      keccakf(unaff_retaddr);
      for (local_2c = 0; local_2c < 0x19; local_2c = local_2c + 1) {
        *(ulong *)((long)in_RDI + (ulong)(local_2c << 3) + 0xd0) = in_RDI[(ulong)local_2c + 1];
      }
      *(undefined2 *)(in_RDI + 0x33) = 0;
      *(undefined2 *)((long)in_RDI + 0x19e) = 1;
    }
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      if ((int)((0x19 - (uint)*(ushort *)((long)in_RDI + 0x19c)) * 8) <=
          (int)(uint)(ushort)in_RDI[0x33]) {
        keccakf(unaff_retaddr);
        for (local_2c = 0; local_2c < 0x19; local_2c = local_2c + 1) {
          *(ulong *)((long)in_RDI + (ulong)(local_2c << 3) + 0xd0) = in_RDI[(ulong)local_2c + 1];
        }
        *(undefined2 *)(in_RDI + 0x33) = 0;
      }
      uVar1 = in_RDI[0x33];
      *(ushort *)(in_RDI + 0x33) = (ushort)uVar1 + 1;
      *(undefined1 *)(in_RSI + local_28) =
           *(undefined1 *)((long)in_RDI + (ulong)(ushort)uVar1 + 0xd0);
    }
  }
  return 0;
}

Assistant:

int sha3_shake_done(hash_state *md, unsigned char *out, unsigned long outlen)
{
   /* IMPORTANT NOTE: sha3_shake_done can be called many times */
   unsigned long idx;
   unsigned i;

   if (outlen == 0) return CRYPT_OK; /* nothing to do */
   LTC_ARGCHK(md  != NULL);
   LTC_ARGCHK(out != NULL);

   if (!md->sha3.xof_flag) {
      /* shake_xof operation must be done only once */
      md->sha3.s[md->sha3.word_index] ^= (md->sha3.saved ^ (CONST64(0x1F) << (md->sha3.byte_index * 8)));
      md->sha3.s[SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words - 1] ^= CONST64(0x8000000000000000);
      keccakf(md->sha3.s);
      /* store sha3.s[] as little-endian bytes into sha3.sb */
      for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
         STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
      }
      md->sha3.byte_index = 0;
      md->sha3.xof_flag = 1;
   }

   for (idx = 0; idx < outlen; idx++) {
      if(md->sha3.byte_index >= (SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words) * 8) {
         keccakf(md->sha3.s);
         /* store sha3.s[] as little-endian bytes into sha3.sb */
         for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
            STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
         }
         md->sha3.byte_index = 0;
      }
      out[idx] = md->sha3.sb[md->sha3.byte_index++];
   }
   return CRYPT_OK;
}